

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::clear(Tree *this)

{
  long *in_RDI;
  Tree *unaff_retaddr;
  size_t i;
  char msg [27];
  basic_substring<const_char> local_80;
  basic_substring<const_char> bStack_70;
  undefined8 local_60;
  ulong local_58;
  Tree *in_stack_ffffffffffffffc0;
  size_t in_stack_fffffffffffffff0;
  
  _clear_range(unaff_retaddr,(size_t)in_RDI,in_stack_fffffffffffffff0);
  in_RDI[2] = 0;
  if (*in_RDI == 0) {
    in_RDI[3] = -1;
    in_RDI[4] = -1;
  }
  else {
    in_RDI[3] = 0;
    in_RDI[4] = in_RDI[1] + -1;
    _claim_root(in_stack_ffffffffffffffc0);
  }
  for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
    basic_substring<const_char>::basic_substring(&local_80);
    basic_substring<const_char>::basic_substring(&bStack_70);
    local_60 = 0;
    memcpy(in_RDI + local_58 * 5 + 0xc,&local_80,0x28);
  }
  return;
}

Assistant:

void Tree::clear()
{
    _clear_range(0, m_cap);
    m_size = 0;
    if(m_buf)
    {
        _RYML_CB_ASSERT(m_callbacks, m_cap >= 0);
        m_free_head = 0;
        m_free_tail = m_cap-1;
        _claim_root();
    }
    else
    {
        m_free_head = NONE;
        m_free_tail = NONE;
    }
    for(size_t i = 0; i < RYML_MAX_TAG_DIRECTIVES; ++i)
        m_tag_directives[i] = {};
}